

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintTo(double d,ostream *os)

{
  long lVar1;
  int iVar2;
  streamsize __prec;
  long *in_RDI;
  double in_XMM0_Qa;
  streamsize old_precision;
  
  __prec = std::ios_base::precision((ios_base *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
  lVar1 = *(long *)(*in_RDI + -0x18);
  iVar2 = AppropriateResolution<double>(in_XMM0_Qa);
  std::ios_base::precision((ios_base *)((long)in_RDI + lVar1),(long)iVar2);
  std::ostream::operator<<(in_RDI,in_XMM0_Qa);
  std::ios_base::precision((ios_base *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),__prec);
  return;
}

Assistant:

inline void PrintTo(double d, ::std::ostream* os) {
  auto old_precision = os->precision();
  os->precision(AppropriateResolution(d));
  *os << d;
  os->precision(old_precision);
}